

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

bool __thiscall
llm_tokenizer_bpe_session::append_eos
          (llm_tokenizer_bpe_session *this,vector<int,_std::allocator<int>_> *output)

{
  bool bVar1;
  llama_token lVar2;
  vector<int,_std::allocator<int>_> *in_RSI;
  value_type_conflict3 *in_stack_ffffffffffffffc8;
  bool local_1;
  
  bVar1 = llama_vocab::get_add_eos((llama_vocab *)0x540d40);
  if (bVar1) {
    lVar2 = llama_vocab::token_eos((llama_vocab *)0x540d53);
    if (lVar2 == -1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
                 ,0x1c3,"GGML_ASSERT(%s) failed","vocab.token_eos() != LLAMA_TOKEN_NULL");
    }
    llama_vocab::token_eos((llama_vocab *)0x540d90);
    llama_vocab::std::vector<int,_std::allocator<int>_>::push_back(in_RSI,in_stack_ffffffffffffffc8)
    ;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool append_eos(std::vector<llama_token> & output) const {
        if (vocab.get_add_eos()) {
            GGML_ASSERT(vocab.token_eos() != LLAMA_TOKEN_NULL);
            output.push_back(vocab.token_eos());
            return true;
        }
        return false;
    }